

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pos_tagger_test.cpp
# Opt level: O0

void __thiscall PosTagger_TestUserDict_Test::TestBody(PosTagger_TestUserDict_Test *this)

{
  bool bVar1;
  AssertionResult gtest_ar_1;
  string s_1;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  res_1;
  AssertionResult gtest_ar;
  string s;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  res;
  MixSegment tagger;
  string *in_stack_fffffffffffffd28;
  undefined7 in_stack_fffffffffffffd30;
  undefined1 in_stack_fffffffffffffd37;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffd40;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  string *in_stack_fffffffffffffd48;
  int line;
  undefined7 in_stack_fffffffffffffd50;
  undefined1 in_stack_fffffffffffffd57;
  undefined1 uVar3;
  string *in_stack_fffffffffffffd58;
  string *this_01;
  Type type;
  MixSegment *in_stack_fffffffffffffd60;
  allocator<char> *__a;
  char *in_stack_fffffffffffffd68;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd70;
  Message *in_stack_fffffffffffffd88;
  AssertHelper *in_stack_fffffffffffffd90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  undefined1 local_239 [61];
  uint local_1fc;
  AssertionResult local_1e8;
  string local_1d8 [39];
  allocator<char> local_1b1;
  string local_1b0 [63];
  allocator<char> local_171;
  string local_170 [39];
  undefined1 local_149 [49];
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffee8;
  string *in_stack_fffffffffffffef0;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
             (allocator<char> *)in_stack_fffffffffffffd60);
  pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_149;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (pbVar2,in_stack_fffffffffffffd68,(allocator<char> *)in_stack_fffffffffffffd60);
  __s = &local_171;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (pbVar2,(char *)__s,(allocator<char> *)in_stack_fffffffffffffd60);
  cppjieba::MixSegment::MixSegment
            (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
             (string *)CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),
             in_stack_fffffffffffffd48);
  std::__cxx11::string::~string(local_170);
  std::allocator<char>::~allocator(&local_171);
  std::__cxx11::string::~string((string *)(local_149 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_149);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffef0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffeef);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)0x1d1788);
  __a = &local_1b1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(pbVar2,(char *)__s,__a);
  cppjieba::MixSegment::Tag
            ((MixSegment *)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),
             in_stack_fffffffffffffd28,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)0x1d17d2);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator(&local_1b1);
  this_01 = local_1d8;
  std::__cxx11::string::string(this_01);
  type = (Type)((ulong)this_01 >> 0x20);
  std::operator<<(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,char_const*>
            ((char *)in_stack_fffffffffffffd48,(char *)in_stack_fffffffffffffd40,
             in_stack_fffffffffffffd38,
             (char **)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1e8);
  uVar3 = bVar1;
  if (!bVar1) {
    testing::Message::Message((Message *)__a);
    in_stack_fffffffffffffd48 =
         (string *)testing::AssertionResult::failure_message((AssertionResult *)0x1d19a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)__a,type,(char *)CONCAT17(uVar3,in_stack_fffffffffffffd50),
               (int)((ulong)in_stack_fffffffffffffd48 >> 0x20),(char *)in_stack_fffffffffffffd40);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30));
    testing::Message::~Message((Message *)0x1d1a05);
  }
  local_1fc = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d1a73);
  if (local_1fc == 0) {
    local_1fc = 0;
  }
  std::__cxx11::string::~string(local_1d8);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(in_stack_fffffffffffffd40);
  if (local_1fc == 0) {
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)0x1d1ac3);
    this_00 = (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_239;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(pbVar2,(char *)__s,__a);
    cppjieba::MixSegment::Tag
              ((MixSegment *)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),
               in_stack_fffffffffffffd28,
               (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)0x1d1b0d);
    std::__cxx11::string::~string((string *)(local_239 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_239);
    pbVar2 = &local_260;
    std::__cxx11::string::string((string *)pbVar2);
    std::operator<<(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    testing::internal::EqHelper<false>::Compare<std::__cxx11::string,char_const*>
              ((char *)in_stack_fffffffffffffd48,(char *)this_00,pbVar2,
               (char **)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30));
    line = (int)((ulong)in_stack_fffffffffffffd48 >> 0x20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffffd90);
    in_stack_fffffffffffffd37 = bVar1;
    if (!bVar1) {
      testing::Message::Message((Message *)__a);
      testing::AssertionResult::failure_message((AssertionResult *)0x1d1c51);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)__a,type,(char *)CONCAT17(uVar3,in_stack_fffffffffffffd50),line,
                 (char *)this_00);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30));
      testing::Message::~Message((Message *)0x1d1c9d);
    }
    local_1fc = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d1cff);
    if (local_1fc == 0) {
      local_1fc = 0;
    }
    std::__cxx11::string::~string((string *)&local_260);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(this_00);
    if (local_1fc == 0) {
      local_1fc = 0;
    }
  }
  cppjieba::MixSegment::~MixSegment
            ((MixSegment *)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30));
  return;
}

Assistant:

TEST(PosTagger, TestUserDict) {
  MixSegment tagger("../dict/jieba.dict.utf8", "../dict/hmm_model.utf8", "../test/testdata/userdict.utf8");
  {
    vector<pair<string, string> > res;
    tagger.Tag(QUERY_TEST2, res);
    string s;
    s << res;
    ASSERT_EQ(s, ANS_TEST2);
  }
  {
    vector<pair<string, string> > res;
    tagger.Tag(QUERY_TEST3, res);
    string s;
    s << res;
    ASSERT_EQ(s, ANS_TEST3);
  }
}